

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * AllocateHeapArray(InstructionVMEvalContext *ctx,TypeBase *target,uint count)

{
  uint offset_00;
  Allocator *allocator;
  uint uVar1;
  int iVar2;
  TypeUnsizedArray *structType;
  undefined4 extraout_var;
  VmType type;
  unsigned_long_long tmp;
  char *storage;
  VmConstant *result;
  uint pointer;
  uint offset;
  uint count_local;
  TypeBase *target_local;
  InstructionVMEvalContext *ctx_local;
  StackFrame *pSVar3;
  
  offset_00 = ctx->heapSize;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,offset_00,(int)target->size * count);
  ctx->heapSize = (int)target->size * count + ctx->heapSize;
  if (ctx->heapSize < 0xffff) {
    if ((offset_00 & 0xffff) != offset_00) {
      __assert_fail("unsigned(pointer & memoryOffsetMask) == pointer",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x285,
                    "VmConstant *AllocateHeapArray(InstructionVMEvalContext &, TypeBase *, unsigned int)"
                   );
    }
    uVar1 = GetStorageIndex(ctx,&ctx->heap);
    ctx_local = (InstructionVMEvalContext *)InstructionVMEvalContext::get<VmConstant>(ctx);
    allocator = ctx->allocator;
    structType = ExpressionContext::GetUnsizedArrayType(ctx->ctx,target);
    type = VmType::ArrayRef((TypeBase *)structType);
    VmConstant::VmConstant((VmConstant *)ctx_local,allocator,type,(SynBase *)0x0);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])
                      (ctx->allocator,(ulong)*(uint *)&ctx_local->hasError);
    pSVar3 = (StackFrame *)CONCAT44(extraout_var,iVar2);
    pSVar3->owner = (VmFunction *)(ulong)(uVar1 << 0x10 | offset_00);
    *(uint *)&(pSVar3->instructionValues).data = count;
    (ctx_local->stackFrames).little[0x10] = pSVar3;
  }
  else {
    ctx_local = (InstructionVMEvalContext *)
                anon_unknown.dwarf_baae3::Report(ctx,"ERROR: heap limit reached");
  }
  return (VmConstant *)ctx_local;
}

Assistant:

VmConstant* AllocateHeapArray(InstructionVMEvalContext &ctx, TypeBase *target, unsigned count)
{
	unsigned offset = ctx.heapSize;

	ctx.heap.Reserve(ctx, offset, unsigned(target->size) * count);
	ctx.heapSize += unsigned(target->size) * count;

	if(ctx.heapSize >= memoryOffsetMask)
		return (VmConstant*)Report(ctx, "ERROR: heap limit reached");

	unsigned pointer = 0;

	pointer = offset;
	assert(unsigned(pointer & memoryOffsetMask) == pointer);
	pointer |= GetStorageIndex(ctx, &ctx.heap) << memoryStorageBits;

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, VmType::ArrayRef(ctx.ctx.GetUnsizedArrayType(target)), NULL);

	char *storage = (char*)ctx.allocator->alloc(result->type.size);

	if(sizeof(void*) == 4)
	{
		memcpy(storage, &pointer, 4);
	}
	else
	{
		unsigned long long tmp = pointer;
		memcpy(storage, &tmp, 8);
	}

	memcpy(storage + sizeof(void*), &count, 4);

	result->sValue = storage;

	return result;
}